

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
atoiTest_testUint64OutOfBoundsHigh_Test::TestBody(atoiTest_testUint64OutOfBoundsHigh_Test *this)

{
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  atoiTest_testUint64OutOfBoundsHigh_Test *local_10;
  atoiTest_testUint64OutOfBoundsHigh_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"18446744073709551616",&local_31);
  test<unsigned_long>(false,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"118446744073709551612",&local_69);
  test<unsigned_long>(false,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,"1111111111111111111111111111111111111",&local_91);
  test<unsigned_long>(false,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_b8,"1111111111111111111111111111111111111111111111111111111111111",
             &local_b9);
  test<unsigned_long>(false,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  return;
}

Assistant:

TEST(atoiTest, testUint64OutOfBoundsHigh) {
  // out of bounds
  test<uint64_t>(false, "18446744073709551616");
  test<uint64_t>(false, "118446744073709551612");
  test<uint64_t>(false, "1111111111111111111111111111111111111");
  test<uint64_t>(false, "1111111111111111111111111111111111111111111111111111111111111");
}